

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O0

ogt_vox_transform *
ogt_vox_transform_multiply
          (ogt_vox_transform *__return_storage_ptr__,ogt_vox_transform *a,ogt_vox_transform *b)

{
  ogt_vox_transform *b_local;
  ogt_vox_transform *a_local;
  
  __return_storage_ptr__->m00 =
       a->m03 * b->m30 + a->m02 * b->m20 + a->m00 * b->m00 + a->m01 * b->m10;
  __return_storage_ptr__->m01 =
       a->m03 * b->m31 + a->m02 * b->m21 + a->m00 * b->m01 + a->m01 * b->m11;
  __return_storage_ptr__->m02 =
       a->m03 * b->m32 + a->m02 * b->m22 + a->m00 * b->m02 + a->m01 * b->m12;
  __return_storage_ptr__->m03 =
       a->m03 * b->m33 + a->m02 * b->m23 + a->m00 * b->m03 + a->m01 * b->m13;
  __return_storage_ptr__->m10 =
       a->m13 * b->m30 + a->m12 * b->m20 + a->m10 * b->m00 + a->m11 * b->m10;
  __return_storage_ptr__->m11 =
       a->m13 * b->m31 + a->m12 * b->m21 + a->m10 * b->m01 + a->m11 * b->m11;
  __return_storage_ptr__->m12 =
       a->m13 * b->m32 + a->m12 * b->m22 + a->m10 * b->m02 + a->m11 * b->m12;
  __return_storage_ptr__->m13 =
       a->m13 * b->m33 + a->m12 * b->m23 + a->m10 * b->m03 + a->m11 * b->m13;
  __return_storage_ptr__->m20 =
       a->m23 * b->m30 + a->m22 * b->m20 + a->m20 * b->m00 + a->m21 * b->m10;
  __return_storage_ptr__->m21 =
       a->m23 * b->m31 + a->m22 * b->m21 + a->m20 * b->m01 + a->m21 * b->m11;
  __return_storage_ptr__->m22 =
       a->m23 * b->m32 + a->m22 * b->m22 + a->m20 * b->m02 + a->m21 * b->m12;
  __return_storage_ptr__->m23 =
       a->m23 * b->m33 + a->m22 * b->m23 + a->m20 * b->m03 + a->m21 * b->m13;
  __return_storage_ptr__->m30 =
       a->m33 * b->m30 + a->m32 * b->m20 + a->m30 * b->m00 + a->m31 * b->m10;
  __return_storage_ptr__->m31 =
       a->m33 * b->m31 + a->m32 * b->m21 + a->m30 * b->m01 + a->m31 * b->m11;
  __return_storage_ptr__->m32 =
       a->m33 * b->m32 + a->m32 * b->m22 + a->m30 * b->m02 + a->m31 * b->m12;
  __return_storage_ptr__->m33 =
       a->m33 * b->m33 + a->m32 * b->m23 + a->m30 * b->m03 + a->m31 * b->m13;
  return __return_storage_ptr__;
}

Assistant:

ogt_vox_transform ogt_vox_transform_multiply(const ogt_vox_transform& a, const ogt_vox_transform& b) {
        ogt_vox_transform r;
        r.m00 = (a.m00 * b.m00) + (a.m01 * b.m10) + (a.m02 * b.m20) + (a.m03 * b.m30);
        r.m01 = (a.m00 * b.m01) + (a.m01 * b.m11) + (a.m02 * b.m21) + (a.m03 * b.m31);
        r.m02 = (a.m00 * b.m02) + (a.m01 * b.m12) + (a.m02 * b.m22) + (a.m03 * b.m32);
        r.m03 = (a.m00 * b.m03) + (a.m01 * b.m13) + (a.m02 * b.m23) + (a.m03 * b.m33);
        r.m10 = (a.m10 * b.m00) + (a.m11 * b.m10) + (a.m12 * b.m20) + (a.m13 * b.m30);
        r.m11 = (a.m10 * b.m01) + (a.m11 * b.m11) + (a.m12 * b.m21) + (a.m13 * b.m31);
        r.m12 = (a.m10 * b.m02) + (a.m11 * b.m12) + (a.m12 * b.m22) + (a.m13 * b.m32);
        r.m13 = (a.m10 * b.m03) + (a.m11 * b.m13) + (a.m12 * b.m23) + (a.m13 * b.m33);
        r.m20 = (a.m20 * b.m00) + (a.m21 * b.m10) + (a.m22 * b.m20) + (a.m23 * b.m30);
        r.m21 = (a.m20 * b.m01) + (a.m21 * b.m11) + (a.m22 * b.m21) + (a.m23 * b.m31);
        r.m22 = (a.m20 * b.m02) + (a.m21 * b.m12) + (a.m22 * b.m22) + (a.m23 * b.m32);
        r.m23 = (a.m20 * b.m03) + (a.m21 * b.m13) + (a.m22 * b.m23) + (a.m23 * b.m33);
        r.m30 = (a.m30 * b.m00) + (a.m31 * b.m10) + (a.m32 * b.m20) + (a.m33 * b.m30);
        r.m31 = (a.m30 * b.m01) + (a.m31 * b.m11) + (a.m32 * b.m21) + (a.m33 * b.m31);
        r.m32 = (a.m30 * b.m02) + (a.m31 * b.m12) + (a.m32 * b.m22) + (a.m33 * b.m32);
        r.m33 = (a.m30 * b.m03) + (a.m31 * b.m13) + (a.m32 * b.m23) + (a.m33 * b.m33);
        return r;
    }